

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportFileGenerator::PopulateCompatibleInterfaceProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gtarget,ImportPropertyMap *properties)

{
  _func_int **pp_Var1;
  TargetType TVar2;
  cmMakefile *this_00;
  undefined8 uVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmExportFileGenerator *pcVar4;
  string *cn;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ifaceProperties;
  undefined1 local_a8 [16];
  undefined1 local_98 [24];
  undefined1 local_80 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pp_Var1 = (_func_int **)(local_80 + 0x10);
  pcVar4 = (cmExportFileGenerator *)local_80;
  local_80._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar4,"COMPATIBLE_INTERFACE_BOOL","");
  PopulateInterfaceProperty(pcVar4,(string *)local_80,gtarget,properties);
  if ((_func_int **)local_80._0_8_ != pp_Var1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  pcVar4 = (cmExportFileGenerator *)local_80;
  local_80._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)pcVar4,"COMPATIBLE_INTERFACE_STRING","")
  ;
  PopulateInterfaceProperty(pcVar4,(string *)local_80,gtarget,properties);
  if ((_func_int **)local_80._0_8_ != pp_Var1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  pcVar4 = (cmExportFileGenerator *)local_80;
  local_80._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pcVar4,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
  PopulateInterfaceProperty(pcVar4,(string *)local_80,gtarget,properties);
  if ((_func_int **)local_80._0_8_ != pp_Var1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  pcVar4 = (cmExportFileGenerator *)local_80;
  local_80._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)pcVar4,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
  PopulateInterfaceProperty(pcVar4,(string *)local_80,gtarget,properties);
  if ((_func_int **)local_80._0_8_ != pp_Var1) {
    operator_delete((void *)local_80._0_8_,(ulong)(local_80._16_8_ + 1));
  }
  local_68._M_allocated_capacity = (size_type)(local_80 + 8);
  local_80._8_4_ = _S_red;
  local_80._16_8_ = (pointer)0x0;
  local_58 = 0;
  local_a8._0_8_ = (string *)local_98;
  local_68._8_8_ = local_68._M_allocated_capacity;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"COMPATIBLE_INTERFACE_BOOL","")
  ;
  getPropertyContents(gtarget,(string *)local_a8,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
  }
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"COMPATIBLE_INTERFACE_STRING","");
  getPropertyContents(gtarget,(string *)local_a8,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
  }
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"COMPATIBLE_INTERFACE_NUMBER_MIN","");
  getPropertyContents(gtarget,(string *)local_a8,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
  }
  local_a8._0_8_ = (string *)local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"COMPATIBLE_INTERFACE_NUMBER_MAX","");
  getPropertyContents(gtarget,(string *)local_a8,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80);
  if ((string *)local_a8._0_8_ != (string *)local_98) {
    operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
  }
  TVar2 = cmGeneratorTarget::GetType(gtarget);
  if (TVar2 != INTERFACE_LIBRARY) {
    local_a8._0_8_ = (string *)local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
    getCompatibleInterfaceProperties
              (gtarget,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_80,(string *)local_a8);
    if ((string *)local_a8._0_8_ != (string *)local_98) {
      operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
    }
    local_a8._0_8_ = (string *)0x0;
    local_a8._8_8_ = (string *)0x0;
    local_98._0_8_ = 0;
    this_00 = cmTarget::GetMakefile(gtarget->Target);
    cmMakefile::GetConfigurations
              ((string *)&local_50,this_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_allocated_capacity != &local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,
                      (ulong)(local_40._M_allocated_capacity + 1));
    }
    uVar3 = local_a8._8_8_;
    if (local_a8._0_8_ != local_a8._8_8_) {
      config = (string *)local_a8._0_8_;
      do {
        getCompatibleInterfaceProperties
                  (gtarget,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_80,config);
        config = config + 1;
      } while (config != (string *)uVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a8);
  }
  uVar3 = local_68._M_allocated_capacity;
  if ((_Rb_tree_node_base *)local_68._M_allocated_capacity != (_Rb_tree_node_base *)(local_80 + 8))
  {
    do {
      pcVar4 = (cmExportFileGenerator *)local_a8;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     "INTERFACE_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (uVar3 + 0x20));
      PopulateInterfaceProperty(pcVar4,(string *)local_a8,gtarget,properties);
      if ((string *)local_a8._0_8_ != (string *)local_98) {
        operator_delete((void *)local_a8._0_8_,local_98._0_8_ + 1);
      }
      uVar3 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar3);
    } while ((_Rb_tree_node_base *)uVar3 != (_Rb_tree_node_base *)(local_80 + 8));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateCompatibleInterfaceProperties(
  cmGeneratorTarget* gtarget, ImportPropertyMap& properties)
{
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_BOOL", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_STRING", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MIN", gtarget,
                                  properties);
  this->PopulateInterfaceProperty("COMPATIBLE_INTERFACE_NUMBER_MAX", gtarget,
                                  properties);

  std::set<std::string> ifaceProperties;

  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_BOOL", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_STRING", ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MIN",
                      ifaceProperties);
  getPropertyContents(gtarget, "COMPATIBLE_INTERFACE_NUMBER_MAX",
                      ifaceProperties);

  if (gtarget->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
    getCompatibleInterfaceProperties(gtarget, ifaceProperties, "");

    std::vector<std::string> configNames;
    gtarget->Target->GetMakefile()->GetConfigurations(configNames);

    for (std::string const& cn : configNames) {
      getCompatibleInterfaceProperties(gtarget, ifaceProperties, cn);
    }
  }

  for (std::string const& ip : ifaceProperties) {
    this->PopulateInterfaceProperty("INTERFACE_" + ip, gtarget, properties);
  }
}